

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *v,void *v_min,void *v_max,
               char *format,float power,ImGuiSliderFlags flags)

{
  undefined8 *puVar1;
  ImVec4 *pIVar2;
  double dVar3;
  char cVar4;
  ImGuiInputSource IVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  ImGuiContext *pIVar14;
  int iVar15;
  int iVar16;
  ImU32 IVar17;
  int iVar18;
  ImRect *pIVar19;
  ImVec2 *pIVar20;
  long lVar21;
  char *pcVar22;
  char *extraout_RAX;
  char *extraout_RAX_00;
  ImGuiContext *pIVar23;
  char *extraout_RAX_01;
  char *extraout_RAX_02;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  ImVec2 *pIVar28;
  long lVar29;
  ulong uVar30;
  char *pcVar31;
  ulong uVar32;
  ulong uVar33;
  ImGuiContext *g;
  ImGuiWindow *pIVar34;
  uint uVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  ImDrawList *this;
  uint uVar40;
  ImGuiContext *pIVar41;
  bool bVar42;
  bool bVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  ulong uVar47;
  float fVar48;
  float fVar49;
  double dVar50;
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  ImVec2 IVar51;
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined4 uVar70;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar71;
  double dVar72;
  double dVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar80 [16];
  char v_str [64];
  ImVec2 local_a8;
  ImVec2 IStack_a0;
  undefined1 local_98 [16];
  undefined8 local_80;
  ImVec4 local_78 [4];
  undefined8 extraout_XMM0_Qb_00;
  
  pIVar14 = GImGui;
  switch(data_type) {
  case 0:
    iVar16 = *v_min;
    if ((iVar16 < -0x40000000) || (iVar37 = *v_max, 0x3fffffff < iVar37)) {
      __assert_fail("*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x234f,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar34 = GImGui->CurrentWindow;
    pIVar34->WriteAccessed = true;
    iVar15 = 9;
    if (pIVar14->ActiveId != id) {
      iVar15 = (pIVar14->HoveredId == id) + 7;
    }
    puVar1 = (undefined8 *)((long)&(pIVar14->Style).Colors[0].x + (ulong)(uint)(iVar15 << 4));
    local_78[0]._0_8_ = *puVar1;
    uVar10 = puVar1[1];
    local_78[0].w = (float)((ulong)uVar10 >> 0x20);
    local_78[0].z = (float)uVar10;
    local_78[0].w = (pIVar14->Style).Alpha * local_78[0].w;
    IVar17 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar17,true,(pIVar14->Style).FrameRounding);
    pIVar41 = GImGui;
    uVar45 = flags & 1;
    iVar15 = iVar37 - iVar16;
    uVar46 = iVar16 - iVar37;
    uVar40 = -uVar46;
    if (0 < (int)uVar46) {
      uVar40 = uVar46;
    }
    pIVar20 = (ImVec2 *)&(bb->Max).y;
    if (uVar45 == 0) {
      pIVar20 = &bb->Max;
    }
    fVar79 = pIVar20->x;
    fVar75 = (fVar79 - (&(bb->Min).x)[uVar45]) + -4.0;
    fVar49 = (pIVar14->Style).GrabMinSize;
    fVar71 = fVar75 / (float)(int)(uVar40 + 1);
    uVar46 = -(uint)(fVar49 <= fVar71);
    fVar74 = (float)(~uVar46 & (uint)fVar49 | (uint)fVar71 & uVar46);
    if (fVar75 <= fVar74) {
      fVar74 = fVar75;
    }
    pIVar19 = (ImRect *)&(bb->Min).y;
    if (uVar45 == 0) {
      pIVar19 = bb;
    }
    fVar71 = fVar74 * 0.5;
    fVar78 = (pIVar19->Min).x + 2.0 + fVar71;
    if (pIVar14->ActiveId == id) {
      if (pIVar14->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar51 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar41 = GImGui;
        fVar49 = IVar51.x;
        if (uVar45 != 0) {
          fVar49 = -IVar51.y;
        }
        if ((pIVar14->NavActivatePressedId == id) && (pIVar14->ActiveIdIsJustActivated == false)) {
          bVar42 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar42;
          if (bVar42) {
            pIVar41->ActiveIdTimer = 0.0;
          }
          bVar42 = false;
          pIVar41->ActiveId = 0;
          pIVar41->ActiveIdAllowNavDirFlags = 0;
          pIVar41->ActiveIdAllowOverlap = false;
          pIVar41->ActiveIdWindow = (ImGuiWindow *)0x0;
          auVar60 = ZEXT816(0);
        }
        else {
          auVar60 = ZEXT816(0);
          if ((fVar49 == 0.0) && (!NAN(fVar49))) goto LAB_0018b4f7;
          if (iVar16 != iVar37) {
            iVar18 = iVar37;
            if (iVar16 < iVar37) {
              iVar18 = iVar16;
            }
            iVar25 = iVar37;
            if (iVar37 < iVar16) {
              iVar25 = iVar16;
            }
            iVar7 = *v;
            if (iVar7 < iVar25) {
              iVar25 = iVar7;
            }
            if (iVar7 < iVar18) {
              iVar25 = iVar18;
            }
            auVar60 = ZEXT416((uint)((float)(iVar25 - iVar16) / (float)iVar15));
          }
          if ((uVar40 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            fVar49 = *(float *)(&DAT_001db168 + (ulong)(fVar49 < 0.0) * 4) / (float)(int)uVar40;
          }
          else {
            fVar49 = fVar49 / 100.0;
          }
          uVar40 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
          fVar75 = (float)(~uVar40 & (uint)fVar49 | (uint)(fVar49 * 10.0) & uVar40);
          fVar49 = auVar60._0_4_;
          if (((fVar49 < 1.0) || (fVar75 <= 0.0)) && ((0.0 < fVar49 || (0.0 <= fVar75)))) {
            fVar49 = fVar49 + fVar75;
            auVar59 = ZEXT812(0x3f800000);
            if (fVar49 <= 1.0) {
              auVar59._4_8_ = 0;
              auVar59._0_4_ = fVar49;
            }
            auVar63._0_4_ = ~-(uint)(fVar49 < 0.0) & auVar59._0_4_;
            auVar63._4_4_ = 0;
            auVar63._8_4_ = ~auVar60._8_4_ & auVar59._8_4_;
            auVar63._12_4_ = 0;
            goto LAB_0018c1cd;
          }
          bVar42 = false;
        }
      }
      else {
        auVar60 = ZEXT816(0);
        if (pIVar14->ActiveIdSource == ImGuiInputSource_Mouse) {
          if ((pIVar14->IO).MouseDown[0] == false) {
            bVar42 = GImGui->ActiveId != 0;
            GImGui->ActiveIdIsJustActivated = bVar42;
            if (bVar42) {
              pIVar41->ActiveIdTimer = 0.0;
            }
            bVar42 = false;
            pIVar41->ActiveId = 0;
            pIVar41->ActiveIdAllowNavDirFlags = 0;
            pIVar41->ActiveIdAllowOverlap = false;
            pIVar41->ActiveIdWindow = (ImGuiWindow *)0x0;
          }
          else {
            auVar63 = auVar60;
            if (0.0 < fVar75 - fVar74) {
              fVar49 = (*(float *)((pIVar14->IO).MouseDown + (ulong)uVar45 * 4 + -8) - fVar78) /
                       (fVar75 - fVar74);
              auVar52 = ZEXT812(0x3f800000);
              if (fVar49 <= 1.0) {
                auVar52._4_8_ = 0;
                auVar52._0_4_ = fVar49;
              }
              auVar63._0_4_ = ~-(uint)(fVar49 < 0.0) & auVar52._0_4_;
              auVar63._4_4_ = 0;
              auVar63._8_4_ = auVar52._8_4_;
              auVar63._12_4_ = 0;
            }
            if (uVar45 != 0) {
              auVar63 = ZEXT416((uint)(1.0 - auVar63._0_4_));
            }
LAB_0018c1cd:
            bVar42 = true;
            auVar60 = auVar63;
          }
        }
        else {
LAB_0018b4f7:
          auVar60 = ZEXT816(0);
          bVar42 = false;
        }
      }
      if (bVar42) {
        fVar49 = auVar60._0_4_ * (float)iVar15;
        uVar46 = (uint)fVar49;
        uVar40 = (uint)(fVar49 + 0.5);
        if ((int)uVar40 < (int)uVar46) {
          uVar40 = uVar46;
        }
        local_a8.x = (float)(uVar40 + iVar16);
        pcVar22 = (char *)(ulong)uVar46;
        do {
          cVar4 = *format;
          if (cVar4 == '\0') {
            iVar18 = 3;
            pcVar31 = pcVar22;
          }
          else if ((cVar4 != '%') || (iVar18 = 1, pcVar31 = format, format[1] == '%')) {
            format = format + (ulong)(cVar4 == '%') + 1;
            iVar18 = 0;
            pcVar31 = pcVar22;
          }
          pcVar22 = pcVar31;
        } while (iVar18 == 0);
        if (iVar18 == 1) {
          format = pcVar31;
        }
        if ((*format == '%') && (format[1] != '%')) {
          ImFormatString((char *)local_78,0x40,format);
          pcVar22 = (char *)((long)&local_80 + 7);
          do {
            pcVar31 = pcVar22 + 1;
            pcVar22 = pcVar22 + 1;
          } while (*pcVar31 == ' ');
          ImAtoi<int>(pcVar22,(int *)&local_a8);
        }
        bVar42 = *v != local_a8.x;
        if (bVar42) {
          *(float *)v = local_a8.x;
          bVar42 = true;
        }
      }
      else {
        bVar42 = false;
      }
    }
    else {
      bVar42 = false;
    }
    fVar79 = fVar79 + -2.0;
    fVar75 = 0.0;
    if (iVar16 != iVar37) {
      iVar18 = iVar37;
      if (iVar16 < iVar37) {
        iVar18 = iVar16;
      }
      if (iVar37 < iVar16) {
        iVar37 = iVar16;
      }
      iVar25 = *v;
      if (iVar25 < iVar37) {
        iVar37 = iVar25;
      }
      if (iVar25 < iVar18) {
        iVar37 = iVar18;
      }
      fVar75 = (float)(iVar37 - iVar16);
      fVar49 = (float)iVar15;
LAB_0018c335:
      fVar75 = fVar75 / fVar49;
    }
    break;
  case 1:
    uVar40 = *v_min;
    if ((int)uVar40 < 0) {
      __assert_fail("*(const ImU32*)v_min <= IM_U32_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2352,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    uVar46 = *v_max;
    pIVar34 = GImGui->CurrentWindow;
    pIVar34->WriteAccessed = true;
    iVar16 = 9;
    if (pIVar14->ActiveId != id) {
      iVar16 = (pIVar14->HoveredId == id) + 7;
    }
    uVar24 = -(uVar40 - uVar46);
    uVar45 = uVar40 - uVar46;
    if (uVar40 < uVar46) {
      uVar45 = uVar24;
    }
    puVar1 = (undefined8 *)((long)&(pIVar14->Style).Colors[0].x + (ulong)(uint)(iVar16 << 4));
    local_78[0]._0_8_ = *puVar1;
    uVar10 = puVar1[1];
    local_78[0].w = (float)((ulong)uVar10 >> 0x20);
    local_78[0].z = (float)uVar10;
    local_78[0].w = (pIVar14->Style).Alpha * local_78[0].w;
    IVar17 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar17,true,(pIVar14->Style).FrameRounding);
    pIVar41 = GImGui;
    uVar35 = flags & 1;
    pIVar20 = (ImVec2 *)&(bb->Max).y;
    pIVar28 = pIVar20;
    if (uVar35 == 0) {
      pIVar28 = &bb->Max;
    }
    fVar49 = (pIVar28->x - (&(bb->Min).x)[uVar35]) + -4.0;
    fVar74 = (pIVar14->Style).GrabMinSize;
    if (-1 < (int)uVar45) {
      fVar71 = fVar49 / (float)(int)(uVar45 + 1);
      uVar44 = -(uint)(fVar74 <= fVar71);
      fVar74 = (float)(~uVar44 & (uint)fVar74 | (uint)fVar71 & uVar44);
    }
    pIVar19 = (ImRect *)&(bb->Min).y;
    if (uVar35 == 0) {
      pIVar19 = bb;
    }
    if (fVar49 <= fVar74) {
      fVar74 = fVar49;
    }
    fVar71 = fVar74 * 0.5;
    if (uVar35 == 0) {
      pIVar20 = &bb->Max;
    }
    fVar78 = (pIVar19->Min).x + 2.0 + fVar71;
    fVar79 = pIVar20->x;
    if (pIVar14->ActiveId == id) {
      if (pIVar14->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar51 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar41 = GImGui;
        fVar49 = IVar51.x;
        if (uVar35 != 0) {
          fVar49 = -IVar51.y;
        }
        if ((pIVar14->NavActivatePressedId == id) && (pIVar14->ActiveIdIsJustActivated == false)) {
          bVar42 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar42;
          if (bVar42) {
            pIVar41->ActiveIdTimer = 0.0;
          }
          pIVar41->ActiveId = 0;
          pIVar41->ActiveIdAllowNavDirFlags = 0;
          pIVar41->ActiveIdAllowOverlap = false;
          pIVar41->ActiveIdWindow = (ImGuiWindow *)0x0;
        }
        else {
          auVar60 = ZEXT816(0);
          if ((fVar49 != 0.0) || (NAN(fVar49))) {
            if (uVar46 != uVar40) {
              uVar35 = uVar46;
              if (uVar46 >= uVar40 && uVar46 != uVar40) {
                uVar35 = uVar40;
              }
              uVar44 = uVar46;
              if (uVar46 < uVar40) {
                uVar44 = uVar40;
              }
              uVar6 = *v;
              if (uVar6 < uVar44) {
                uVar44 = uVar6;
              }
              if (uVar6 < uVar35) {
                uVar44 = uVar35;
              }
              auVar60 = ZEXT416((uint)((float)(uVar44 - uVar40) / (float)uVar24));
            }
            if ((uVar45 + 100 < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              fVar49 = *(float *)(&DAT_001db168 + (ulong)(fVar49 < 0.0) * 4) / (float)(int)uVar45;
            }
            else {
              fVar49 = fVar49 / 100.0;
            }
            uVar45 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar75 = (float)(~uVar45 & (uint)fVar49 | (uint)(fVar49 * 10.0) & uVar45);
            fVar49 = auVar60._0_4_;
            if (((fVar49 < 1.0) || (fVar75 <= 0.0)) && ((0.0 < fVar49 || (0.0 <= fVar75)))) {
              fVar49 = fVar49 + fVar75;
              auVar57 = ZEXT812(0x3f800000);
              if (fVar49 <= 1.0) {
                auVar57._4_8_ = 0;
                auVar57._0_4_ = fVar49;
              }
              auVar66._0_4_ = ~-(uint)(fVar49 < 0.0) & auVar57._0_4_;
              auVar66._4_4_ = 0;
              auVar66._8_4_ = ~auVar60._8_4_ & auVar57._8_4_;
              auVar66._12_4_ = 0;
              goto LAB_0018bdef;
            }
            bVar42 = false;
            goto LAB_0018bdf1;
          }
        }
LAB_0018b94d:
        bVar42 = false;
        auVar60 = ZEXT816(0);
      }
      else {
        auVar60 = ZEXT816(0);
        if (pIVar14->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_0018b94d;
        if ((pIVar14->IO).MouseDown[0] == false) {
          bVar42 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar42;
          if (bVar42) {
            pIVar41->ActiveIdTimer = 0.0;
          }
          bVar42 = false;
          pIVar41->ActiveId = 0;
          pIVar41->ActiveIdAllowNavDirFlags = 0;
          pIVar41->ActiveIdAllowOverlap = false;
          pIVar41->ActiveIdWindow = (ImGuiWindow *)0x0;
        }
        else {
          auVar66 = auVar60;
          if (0.0 < fVar49 - fVar74) {
            fVar49 = (*(float *)((pIVar14->IO).MouseDown + (ulong)uVar35 * 4 + -8) - fVar78) /
                     (fVar49 - fVar74);
            auVar55 = ZEXT812(0x3f800000);
            if (fVar49 <= 1.0) {
              auVar55._4_8_ = 0;
              auVar55._0_4_ = fVar49;
            }
            auVar66._0_4_ = ~-(uint)(fVar49 < 0.0) & auVar55._0_4_;
            auVar66._4_4_ = 0;
            auVar66._8_4_ = auVar55._8_4_;
            auVar66._12_4_ = 0;
          }
          if (uVar35 != 0) {
            auVar66 = ZEXT416((uint)(1.0 - auVar66._0_4_));
          }
LAB_0018bdef:
          bVar42 = true;
          auVar60 = auVar66;
        }
      }
LAB_0018bdf1:
      if (bVar42) {
        fVar49 = auVar60._0_4_ * (float)uVar24;
        pcVar22 = (char *)(long)fVar49;
        uVar35 = (uint)pcVar22;
        uVar45 = (uint)(long)(fVar49 + 0.5);
        if (uVar45 < uVar35) {
          uVar45 = uVar35;
        }
        local_a8.x = (float)(uVar45 + uVar40);
        do {
          cVar4 = *format;
          if (cVar4 == '\0') {
            iVar16 = 3;
            pcVar31 = pcVar22;
          }
          else if ((cVar4 != '%') || (iVar16 = 1, pcVar31 = format, format[1] == '%')) {
            format = format + (ulong)(cVar4 == '%') + 1;
            iVar16 = 0;
            pcVar31 = pcVar22;
          }
          pcVar22 = pcVar31;
        } while (iVar16 == 0);
        if (iVar16 == 1) {
          format = pcVar31;
        }
        if ((*format == '%') && (format[1] != '%')) {
          ImFormatString((char *)local_78,0x40,format);
          pcVar22 = (char *)((long)&local_80 + 7);
          do {
            pcVar31 = pcVar22 + 1;
            pcVar22 = pcVar22 + 1;
          } while (*pcVar31 == ' ');
          ImAtoi<int>(pcVar22,(int *)&local_a8);
        }
        bVar42 = *v != local_a8.x;
        if (bVar42) {
          *(float *)v = local_a8.x;
          bVar42 = true;
        }
      }
      else {
        bVar42 = false;
      }
    }
    else {
      bVar42 = false;
    }
    fVar79 = fVar79 + -2.0;
    fVar75 = 0.0;
    if (uVar46 != uVar40) {
      uVar45 = uVar46;
      if (uVar46 >= uVar40 && uVar46 != uVar40) {
        uVar45 = uVar40;
      }
      if (uVar46 < uVar40) {
        uVar46 = uVar40;
      }
      uVar35 = *v;
      if (uVar35 < uVar46) {
        uVar46 = uVar35;
      }
      if (uVar35 < uVar45) {
        uVar46 = uVar45;
      }
      fVar75 = (float)(uVar46 - uVar40);
      fVar49 = (float)uVar24;
      goto LAB_0018c335;
    }
    break;
  case 2:
    lVar38 = *v_min;
    if ((lVar38 < -0x4000000000000000) || (lVar39 = *v_max, 0x3fffffffffffffff < lVar39)) {
      __assert_fail("*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2355,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar34 = GImGui->CurrentWindow;
    pIVar34->WriteAccessed = true;
    iVar16 = 9;
    if (pIVar14->ActiveId != id) {
      iVar16 = (pIVar14->HoveredId == id) + 7;
    }
    puVar1 = (undefined8 *)((long)&(pIVar14->Style).Colors[0].x + (ulong)(uint)(iVar16 << 4));
    local_78[0]._0_8_ = *puVar1;
    uVar10 = puVar1[1];
    local_78[0].w = (float)((ulong)uVar10 >> 0x20);
    local_78[0].z = (float)uVar10;
    local_78[0].w = (pIVar14->Style).Alpha * local_78[0].w;
    IVar17 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar17,true,(pIVar14->Style).FrameRounding);
    pIVar41 = GImGui;
    uVar40 = flags & 1;
    lVar36 = lVar39 - lVar38;
    uVar26 = lVar38 - lVar39;
    uVar47 = -uVar26;
    if (0 < (long)uVar26) {
      uVar47 = uVar26;
    }
    pIVar20 = (ImVec2 *)&(bb->Max).y;
    if (uVar40 == 0) {
      pIVar20 = &bb->Max;
    }
    fVar79 = pIVar20->x;
    fVar75 = (fVar79 - (&(bb->Min).x)[uVar40]) + -4.0;
    fVar49 = (pIVar14->Style).GrabMinSize;
    fVar71 = fVar75 / (float)(long)(uVar47 + 1);
    uVar46 = -(uint)(fVar49 <= fVar71);
    fVar74 = (float)(~uVar46 & (uint)fVar49 | (uint)fVar71 & uVar46);
    if (fVar75 <= fVar74) {
      fVar74 = fVar75;
    }
    pIVar19 = (ImRect *)&(bb->Min).y;
    if (uVar40 == 0) {
      pIVar19 = bb;
    }
    fVar71 = fVar74 * 0.5;
    fVar78 = (pIVar19->Min).x + 2.0 + fVar71;
    if (pIVar14->ActiveId == id) {
      if (pIVar14->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar51 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar41 = GImGui;
        fVar49 = IVar51.x;
        if (uVar40 != 0) {
          fVar49 = -IVar51.y;
        }
        if ((pIVar14->NavActivatePressedId == id) && (pIVar14->ActiveIdIsJustActivated == false)) {
          bVar42 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar42;
          if (bVar42) {
            pIVar41->ActiveIdTimer = 0.0;
          }
          bVar42 = false;
          pIVar41->ActiveId = 0;
          pIVar41->ActiveIdAllowNavDirFlags = 0;
          pIVar41->ActiveIdAllowOverlap = false;
          pIVar41->ActiveIdWindow = (ImGuiWindow *)0x0;
          auVar69 = ZEXT816(0);
        }
        else {
          auVar69 = ZEXT816(0);
          if ((fVar49 == 0.0) && (!NAN(fVar49))) goto LAB_0018b3d5;
          if (lVar38 != lVar39) {
            lVar21 = lVar39;
            if (lVar38 < lVar39) {
              lVar21 = lVar38;
            }
            lVar29 = lVar39;
            if (lVar39 < lVar38) {
              lVar29 = lVar38;
            }
            lVar9 = *v;
            if (lVar9 < lVar29) {
              lVar29 = lVar9;
            }
            if (lVar9 < lVar21) {
              lVar29 = lVar21;
            }
            dVar73 = (double)(lVar29 - lVar38) / (double)lVar36;
            auVar69._0_4_ = (float)dVar73;
            auVar69._4_8_ = (ulong)dVar73 >> 0x20;
            auVar69._12_4_ = 0;
          }
          if ((uVar47 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            fVar49 = *(float *)(&DAT_001db168 + (ulong)(fVar49 < 0.0) * 4) / (float)(long)uVar47;
          }
          else {
            fVar49 = fVar49 / 100.0;
          }
          uVar40 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
          fVar75 = (float)(~uVar40 & (uint)fVar49 | (uint)(fVar49 * 10.0) & uVar40);
          fVar49 = auVar69._0_4_;
          if (((fVar49 < 1.0) || (fVar75 <= 0.0)) && ((0.0 < fVar49 || (0.0 <= fVar75)))) {
            fVar49 = fVar49 + fVar75;
            auVar58 = ZEXT812(0x3f800000);
            if (fVar49 <= 1.0) {
              auVar58._4_8_ = 0;
              auVar58._0_4_ = fVar49;
            }
            auVar64._0_4_ = ~-(uint)(fVar49 < 0.0) & auVar58._0_4_;
            auVar64._4_4_ = 0;
            auVar64._8_4_ = ~auVar69._8_4_ & auVar58._8_4_;
            auVar64._12_4_ = 0;
            goto LAB_0018bfd0;
          }
          bVar42 = false;
        }
      }
      else {
        auVar69 = ZEXT816(0);
        if (pIVar14->ActiveIdSource == ImGuiInputSource_Mouse) {
          if ((pIVar14->IO).MouseDown[0] == false) {
            bVar42 = GImGui->ActiveId != 0;
            GImGui->ActiveIdIsJustActivated = bVar42;
            if (bVar42) {
              pIVar41->ActiveIdTimer = 0.0;
            }
            bVar42 = false;
            pIVar41->ActiveId = 0;
            pIVar41->ActiveIdAllowNavDirFlags = 0;
            pIVar41->ActiveIdAllowOverlap = false;
            pIVar41->ActiveIdWindow = (ImGuiWindow *)0x0;
          }
          else {
            auVar64 = auVar69;
            if (0.0 < fVar75 - fVar74) {
              fVar49 = (*(float *)((pIVar14->IO).MouseDown + (ulong)uVar40 * 4 + -8) - fVar78) /
                       (fVar75 - fVar74);
              auVar53 = ZEXT812(0x3f800000);
              if (fVar49 <= 1.0) {
                auVar53._4_8_ = 0;
                auVar53._0_4_ = fVar49;
              }
              auVar64._0_4_ = ~-(uint)(fVar49 < 0.0) & auVar53._0_4_;
              auVar64._4_4_ = 0;
              auVar64._8_4_ = auVar53._8_4_;
              auVar64._12_4_ = 0;
            }
            if (uVar40 != 0) {
              auVar64 = ZEXT416((uint)(1.0 - auVar64._0_4_));
            }
LAB_0018bfd0:
            bVar42 = true;
            auVar69 = auVar64;
          }
        }
        else {
LAB_0018b3d5:
          auVar69 = ZEXT816(0);
          bVar42 = false;
        }
      }
      if (bVar42) {
        fVar49 = auVar69._0_4_ * (float)lVar36;
        pcVar22 = (char *)(long)fVar49;
        pcVar31 = (char *)(long)(fVar49 + 0.5);
        if ((long)pcVar31 < (long)pcVar22) {
          pcVar31 = pcVar22;
        }
        local_a8 = (ImVec2)((long)pcVar31 + lVar38);
        do {
          cVar4 = *format;
          if (cVar4 == '\0') {
            iVar16 = 3;
            pcVar31 = pcVar22;
          }
          else if ((cVar4 != '%') || (iVar16 = 1, pcVar31 = format, format[1] == '%')) {
            format = format + (ulong)(cVar4 == '%') + 1;
            iVar16 = 0;
            pcVar31 = pcVar22;
          }
          pcVar22 = pcVar31;
        } while (iVar16 == 0);
        if (iVar16 == 1) {
          format = pcVar31;
        }
        if ((*format == '%') && (format[1] != '%')) {
          ImFormatString((char *)local_78,0x40,format);
          pcVar22 = (char *)((long)&local_80 + 7);
          do {
            pcVar31 = pcVar22 + 1;
            pcVar22 = pcVar22 + 1;
          } while (*pcVar31 == ' ');
          ImAtoi<long_long>(pcVar22,(longlong *)&local_a8);
        }
        bVar42 = *v != local_a8;
        if (bVar42) {
          *(ImVec2 *)v = local_a8;
          bVar42 = true;
        }
      }
      else {
        bVar42 = false;
      }
    }
    else {
      bVar42 = false;
    }
    fVar79 = fVar79 + -2.0;
    fVar75 = 0.0;
    if (lVar38 != lVar39) {
      lVar21 = lVar39;
      if (lVar38 < lVar39) {
        lVar21 = lVar38;
      }
      if (lVar39 < lVar38) {
        lVar39 = lVar38;
      }
      lVar29 = *v;
      if (lVar29 < lVar39) {
        lVar39 = lVar29;
      }
      if (lVar29 < lVar21) {
        lVar39 = lVar21;
      }
      fVar75 = (float)((double)(lVar39 - lVar38) / (double)lVar36);
    }
    break;
  case 3:
    uVar47 = *v_min;
    if ((long)uVar47 < 0) {
      __assert_fail("*(const ImU64*)v_min <= IM_U64_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2358,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    uVar26 = *v_max;
    pIVar34 = GImGui->CurrentWindow;
    pIVar34->WriteAccessed = true;
    iVar16 = 9;
    if (pIVar14->ActiveId != id) {
      iVar16 = (pIVar14->HoveredId == id) + 7;
    }
    uVar27 = -(uVar47 - uVar26);
    uVar30 = uVar47 - uVar26;
    if (uVar47 < uVar26) {
      uVar30 = uVar27;
    }
    puVar1 = (undefined8 *)((long)&(pIVar14->Style).Colors[0].x + (ulong)(uint)(iVar16 << 4));
    local_78[0]._0_8_ = *puVar1;
    uVar10 = puVar1[1];
    local_78[0].w = (float)((ulong)uVar10 >> 0x20);
    local_78[0].z = (float)uVar10;
    local_78[0].w = (pIVar14->Style).Alpha * local_78[0].w;
    IVar17 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar17,true,(pIVar14->Style).FrameRounding);
    pIVar41 = GImGui;
    uVar40 = flags & 1;
    pIVar20 = (ImVec2 *)&(bb->Max).y;
    pIVar28 = pIVar20;
    if (uVar40 == 0) {
      pIVar28 = &bb->Max;
    }
    fVar49 = (pIVar28->x - (&(bb->Min).x)[uVar40]) + -4.0;
    fVar74 = (pIVar14->Style).GrabMinSize;
    if (-1 < (long)uVar30) {
      fVar71 = fVar49 / (float)(long)(uVar30 + 1);
      uVar46 = -(uint)(fVar74 <= fVar71);
      fVar74 = (float)(~uVar46 & (uint)fVar74 | (uint)fVar71 & uVar46);
    }
    pIVar19 = (ImRect *)&(bb->Min).y;
    if (uVar40 == 0) {
      pIVar19 = bb;
    }
    if (fVar49 <= fVar74) {
      fVar74 = fVar49;
    }
    fVar71 = fVar74 * 0.5;
    if (uVar40 == 0) {
      pIVar20 = &bb->Max;
    }
    fVar78 = (pIVar19->Min).x + 2.0 + fVar71;
    fVar79 = pIVar20->x;
    uVar70 = (undefined4)(uVar27 >> 0x20);
    if (pIVar14->ActiveId == id) {
      if (pIVar14->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar51 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar41 = GImGui;
        fVar49 = IVar51.x;
        if (uVar40 != 0) {
          fVar49 = -IVar51.y;
        }
        if ((pIVar14->NavActivatePressedId == id) && (pIVar14->ActiveIdIsJustActivated == false)) {
          bVar42 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar42;
          if (bVar42) {
            pIVar41->ActiveIdTimer = 0.0;
          }
          pIVar41->ActiveId = 0;
          pIVar41->ActiveIdAllowNavDirFlags = 0;
          pIVar41->ActiveIdAllowOverlap = false;
          pIVar41->ActiveIdWindow = (ImGuiWindow *)0x0;
        }
        else {
          auVar60 = ZEXT816(0);
          if ((fVar49 != 0.0) || (NAN(fVar49))) {
            if (uVar26 != uVar47) {
              uVar33 = uVar26;
              if (uVar26 >= uVar47 && uVar26 != uVar47) {
                uVar33 = uVar47;
              }
              uVar8 = *v;
              uVar32 = uVar26;
              if (uVar26 < uVar47) {
                uVar32 = uVar47;
              }
              if (uVar8 < uVar32) {
                uVar32 = uVar8;
              }
              if (uVar8 < uVar33) {
                uVar32 = uVar33;
              }
              lVar38 = uVar32 - uVar47;
              auVar67._8_4_ = (int)((ulong)lVar38 >> 0x20);
              auVar67._0_8_ = lVar38;
              auVar67._12_4_ = 0x45300000;
              auVar68._8_4_ = uVar70;
              auVar68._0_8_ = uVar27;
              auVar68._12_4_ = 0x45300000;
              auVar60 = ZEXT416((uint)(float)(((auVar67._8_8_ - 1.9342813113834067e+25) +
                                              ((double)CONCAT44(0x43300000,(int)lVar38) -
                                              4503599627370496.0)) /
                                             ((auVar68._8_8_ - 1.9342813113834067e+25) +
                                             ((double)CONCAT44(0x43300000,(int)uVar27) -
                                             4503599627370496.0))));
            }
            if ((uVar30 + 100 < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              fVar49 = *(float *)(&DAT_001db168 + (ulong)(fVar49 < 0.0) * 4) / (float)(long)uVar30;
            }
            else {
              fVar49 = fVar49 / 100.0;
            }
            uVar40 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar75 = (float)(~uVar40 & (uint)fVar49 | (uint)(fVar49 * 10.0) & uVar40);
            fVar49 = auVar60._0_4_;
            if (((fVar49 < 1.0) || (fVar75 <= 0.0)) && ((0.0 < fVar49 || (0.0 <= fVar75)))) {
              fVar49 = fVar49 + fVar75;
              auVar56 = ZEXT812(0x3f800000);
              if (fVar49 <= 1.0) {
                auVar56._4_8_ = 0;
                auVar56._0_4_ = fVar49;
              }
              auVar65._0_4_ = ~-(uint)(fVar49 < 0.0) & auVar56._0_4_;
              auVar65._4_4_ = 0;
              auVar65._8_4_ = ~auVar60._8_4_ & auVar56._8_4_;
              auVar65._12_4_ = 0;
              goto LAB_0018bb7b;
            }
            bVar42 = false;
            goto LAB_0018bb7d;
          }
        }
LAB_0018b8dd:
        bVar42 = false;
        auVar60 = ZEXT816(0);
      }
      else {
        auVar60 = ZEXT816(0);
        if (pIVar14->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_0018b8dd;
        if ((pIVar14->IO).MouseDown[0] == false) {
          bVar42 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar42;
          if (bVar42) {
            pIVar41->ActiveIdTimer = 0.0;
          }
          bVar42 = false;
          pIVar41->ActiveId = 0;
          pIVar41->ActiveIdAllowNavDirFlags = 0;
          pIVar41->ActiveIdAllowOverlap = false;
          pIVar41->ActiveIdWindow = (ImGuiWindow *)0x0;
        }
        else {
          auVar65 = auVar60;
          if (0.0 < fVar49 - fVar74) {
            fVar49 = (*(float *)((pIVar14->IO).MouseDown + (ulong)uVar40 * 4 + -8) - fVar78) /
                     (fVar49 - fVar74);
            auVar54 = ZEXT812(0x3f800000);
            if (fVar49 <= 1.0) {
              auVar54._4_8_ = 0;
              auVar54._0_4_ = fVar49;
            }
            auVar65._0_4_ = ~-(uint)(fVar49 < 0.0) & auVar54._0_4_;
            auVar65._4_4_ = 0;
            auVar65._8_4_ = auVar54._8_4_;
            auVar65._12_4_ = 0;
          }
          if (uVar40 != 0) {
            auVar65 = ZEXT416((uint)(1.0 - auVar65._0_4_));
          }
LAB_0018bb7b:
          bVar42 = true;
          auVar60 = auVar65;
        }
      }
LAB_0018bb7d:
      if (bVar42) {
        fVar49 = auVar60._0_4_ * (float)uVar27;
        uVar33 = (long)(fVar49 - 9.223372e+18) & (long)fVar49 >> 0x3f | (long)fVar49;
        pcVar22 = (char *)(long)(fVar49 + 0.5);
        uVar30 = (long)((fVar49 + 0.5) - 9.223372e+18) & (long)pcVar22 >> 0x3f | (ulong)pcVar22;
        if (uVar30 < uVar33) {
          uVar30 = uVar33;
        }
        local_a8 = (ImVec2)(uVar30 + uVar47);
        do {
          cVar4 = *format;
          if (cVar4 == '\0') {
            iVar16 = 3;
            pcVar31 = pcVar22;
          }
          else if ((cVar4 != '%') || (iVar16 = 1, pcVar31 = format, format[1] == '%')) {
            format = format + (ulong)(cVar4 == '%') + 1;
            iVar16 = 0;
            pcVar31 = pcVar22;
          }
          pcVar22 = pcVar31;
        } while (iVar16 == 0);
        if (iVar16 == 1) {
          format = pcVar31;
        }
        if ((*format == '%') && (format[1] != '%')) {
          ImFormatString((char *)local_78,0x40,format);
          pcVar22 = (char *)((long)&local_80 + 7);
          do {
            pcVar31 = pcVar22 + 1;
            pcVar22 = pcVar22 + 1;
          } while (*pcVar31 == ' ');
          ImAtoi<long_long>(pcVar22,(longlong *)&local_a8);
        }
        bVar42 = *v != local_a8;
        if (bVar42) {
          *(ImVec2 *)v = local_a8;
          bVar42 = true;
        }
      }
      else {
        bVar42 = false;
      }
    }
    else {
      bVar42 = false;
    }
    fVar79 = fVar79 + -2.0;
    fVar75 = 0.0;
    if (uVar26 != uVar47) {
      uVar30 = uVar26;
      if (uVar47 < uVar26) {
        uVar30 = uVar47;
      }
      uVar33 = *v;
      if (uVar26 < uVar47) {
        uVar26 = uVar47;
      }
      if (uVar33 < uVar26) {
        uVar26 = uVar33;
      }
      if (uVar33 < uVar30) {
        uVar26 = uVar30;
      }
      lVar38 = uVar26 - uVar47;
      auVar61._8_4_ = (int)((ulong)lVar38 >> 0x20);
      auVar61._0_8_ = lVar38;
      auVar61._12_4_ = 0x45300000;
      auVar62._8_4_ = uVar70;
      auVar62._0_8_ = uVar27;
      auVar62._12_4_ = 0x45300000;
      fVar75 = (float)(((auVar61._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar38) - 4503599627370496.0)) /
                      ((auVar62._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar27) - 4503599627370496.0)));
    }
    break;
  case 4:
    fVar49 = *v_min;
    if ((fVar49 < -1.7014117e+38) || (fVar71 = *v_max, 1.7014117e+38 < fVar71)) {
      __assert_fail("*(const float*)v_min >= -3.40282347e+38F/2.0f && *(const float*)v_max <= 3.40282347e+38F/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x235b,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar34 = GImGui->CurrentWindow;
    pIVar34->WriteAccessed = true;
    iVar16 = 9;
    if (pIVar14->ActiveId != id) {
      iVar16 = (pIVar14->HoveredId == id) + 7;
    }
    puVar1 = (undefined8 *)((long)&(pIVar14->Style).Colors[0].x + (ulong)(uint)(iVar16 << 4));
    local_78[0]._0_8_ = *puVar1;
    uVar10 = puVar1[1];
    local_78[0].w = (float)((ulong)uVar10 >> 0x20);
    local_78[0].z = (float)uVar10;
    local_78[0].w = (pIVar14->Style).Alpha * local_78[0].w;
    IVar17 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar17,true,(pIVar14->Style).FrameRounding);
    uVar40 = flags & 1;
    pIVar41 = (ImGuiContext *)(ulong)uVar40;
    pIVar19 = (ImRect *)&(bb->Min).y;
    pIVar20 = (ImVec2 *)&(bb->Max).y;
    if (uVar40 == 0) {
      pIVar19 = bb;
      pIVar20 = &bb->Max;
    }
    fVar79 = pIVar20->x;
    fVar75 = (fVar79 - (&(bb->Min).x)[(long)pIVar41]) + -4.0;
    fVar74 = (pIVar14->Style).GrabMinSize;
    if (fVar75 <= fVar74) {
      fVar74 = fVar75;
    }
    fVar78 = (pIVar19->Min).x;
    if (((power == 1.0) && (!NAN(power))) || (0.0 <= fVar49 * fVar71)) {
      fVar77 = (float)(-(uint)(fVar49 < 0.0) & 0x3f800000);
    }
    else {
      uVar46 = -(uint)(-fVar49 <= fVar49);
      local_98._0_4_ = fVar75;
      local_80 = (double)CONCAT44(local_80._4_4_,1.0 / power);
      fVar77 = powf((float)(uVar46 & (uint)fVar49 | ~uVar46 & (uint)-fVar49),1.0 / power);
      uVar46 = -(uint)(-fVar71 <= fVar71);
      fVar75 = powf((float)(uVar46 & (uint)fVar71 | ~uVar46 & (uint)-fVar71),(float)local_80);
      fVar77 = fVar77 / (fVar75 + fVar77);
      fVar75 = (float)local_98._0_4_;
    }
    pIVar23 = GImGui;
    fVar78 = fVar78 + 2.0 + fVar74 * 0.5;
    if (pIVar14->ActiveId == id) {
      IVar5 = pIVar14->ActiveIdSource;
      if (IVar5 == ImGuiInputSource_Nav) {
        IVar51 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar41 = GImGui;
        fVar75 = IVar51.y;
        auVar80._8_4_ = (float)(int)extraout_XMM0_Qb;
        auVar80._0_4_ = IVar51.x;
        auVar80._4_4_ = IVar51.y;
        auVar80._12_4_ = (float)(int)((ulong)extraout_XMM0_Qb >> 0x20);
        if (uVar40 != 0) {
          auVar80._0_8_ = CONCAT44(fVar75,fVar75) ^ 0x8000000080000000;
          auVar80._8_4_ = -fVar75;
          auVar80._12_4_ = -fVar75;
        }
        if ((pIVar14->NavActivatePressedId == id) && (pIVar14->ActiveIdIsJustActivated == false)) {
          bVar42 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar42;
          if (bVar42) {
            pIVar41->ActiveIdTimer = 0.0;
          }
          pcVar22 = (char *)0x0;
          pIVar41->ActiveId = 0;
          pIVar41->ActiveIdAllowNavDirFlags = 0;
          pIVar41->ActiveIdAllowOverlap = false;
          pIVar41->ActiveIdWindow = (ImGuiWindow *)0x0;
          fVar76 = 0.0;
        }
        else {
          fVar76 = 0.0;
          if ((auVar80._0_4_ != 0.0) || (NAN(auVar80._0_4_))) {
            if ((fVar49 != fVar71) || (NAN(fVar49) || NAN(fVar71))) {
              fVar75 = *v;
              fVar48 = fVar71;
              fVar76 = fVar49;
              if (fVar71 <= fVar49) {
                fVar48 = fVar49;
                fVar76 = fVar71;
              }
              if (fVar75 <= fVar48) {
                fVar48 = fVar75;
              }
              fVar75 = (float)(~-(uint)(fVar75 < fVar76) & (uint)fVar48 |
                              (uint)fVar76 & -(uint)(fVar75 < fVar76));
              if ((power != 1.0) || (NAN(power))) {
                local_98 = auVar80;
                if (0.0 <= fVar75) {
                  fVar76 = (float)(~-(uint)(fVar49 <= 0.0) & (uint)fVar49);
                  fVar75 = powf((fVar75 - fVar76) / (fVar71 - fVar76),1.0 / power);
                  fVar76 = (1.0 - fVar77) * fVar75 + fVar77;
                  auVar80 = local_98;
                }
                else {
                  fVar76 = 0.0;
                  if (fVar71 <= 0.0) {
                    fVar76 = fVar71;
                  }
                  fVar75 = powf(1.0 - (fVar75 - fVar49) / (fVar76 - fVar49),1.0 / power);
                  fVar76 = (1.0 - fVar75) * fVar77;
                  auVar80 = local_98;
                }
              }
              else {
                fVar76 = (fVar75 - fVar49) / (fVar71 - fVar49);
              }
            }
            fVar75 = auVar80._0_4_ / 100.0;
            uVar46 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xe]);
            fVar75 = (float)(~uVar46 & (uint)fVar75 | (uint)(fVar75 / 10.0) & uVar46);
            uVar46 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar75 = (float)(uVar46 & (uint)(fVar75 * 10.0) | ~uVar46 & (uint)fVar75);
            if (((fVar76 < 1.0) || (fVar75 <= 0.0)) && ((0.0 < fVar76 || (0.0 <= fVar75)))) {
              fVar76 = fVar76 + fVar75;
              fVar75 = 1.0;
              if (fVar76 <= 1.0) {
                fVar75 = fVar76;
              }
              fVar76 = (float)(~-(uint)(fVar76 < 0.0) & (uint)fVar75);
              pIVar23 = GImGui;
              goto LAB_0018c5dc;
            }
          }
          pcVar22 = (char *)0x0;
        }
      }
      else {
        fVar76 = 0.0;
        if (IVar5 == ImGuiInputSource_Mouse) {
          if ((pIVar14->IO).MouseDown[0] == false) {
            bVar42 = GImGui->ActiveId != 0;
            GImGui->ActiveIdIsJustActivated = bVar42;
            if (bVar42) {
              pIVar23->ActiveIdTimer = 0.0;
            }
            pcVar22 = (char *)0x0;
            pIVar23->ActiveId = 0;
            pIVar23->ActiveIdAllowNavDirFlags = 0;
            pIVar23->ActiveIdAllowOverlap = false;
            pIVar23->ActiveIdWindow = (ImGuiWindow *)0x0;
          }
          else {
            pIVar23 = (ImGuiContext *)(ulong)IVar5;
            if (0.0 < fVar75 - fVar74) {
              fVar75 = (*(float *)((pIVar14->IO).MouseDown + (long)pIVar41 * 4 + -8) - fVar78) /
                       (fVar75 - fVar74);
              fVar76 = 1.0;
              if (fVar75 <= 1.0) {
                fVar76 = fVar75;
              }
              fVar76 = (float)(~-(uint)(fVar75 < 0.0) & (uint)fVar76);
              pIVar23 = pIVar41;
            }
            if (uVar40 != 0) {
              fVar76 = 1.0 - fVar76;
            }
LAB_0018c5dc:
            pcVar22 = (char *)CONCAT71((int7)((ulong)pIVar23 >> 8),1);
          }
        }
        else {
          pcVar22 = (char *)0x0;
        }
      }
      if ((char)pcVar22 == '\0') {
        bVar42 = false;
      }
      else {
        if ((power != 1.0) || (NAN(power))) {
          if (fVar77 <= fVar76) {
            uVar46 = -(uint)(1e-06 < ABS(fVar77 + -1.0));
            fVar48 = powf((float)(~uVar46 & (uint)fVar76 |
                                 (uint)((fVar76 - fVar77) / (1.0 - fVar77)) & uVar46),power);
            pcVar22 = extraout_RAX_00;
            fVar76 = (float)(-(uint)(0.0 <= fVar49) & (uint)fVar49);
            fVar75 = fVar71;
          }
          else {
            fVar48 = powf(1.0 - fVar76 / fVar77,power);
            pcVar22 = extraout_RAX;
            fVar76 = fVar71;
            fVar75 = fVar49;
            if (0.0 <= fVar71) {
              fVar76 = 0.0;
            }
          }
          fVar76 = (fVar75 - fVar76) * fVar48 + fVar76;
        }
        else {
          fVar76 = (fVar71 - fVar49) * fVar76 + fVar49;
        }
        do {
          cVar4 = *format;
          if (cVar4 == '\0') {
            iVar16 = 3;
            pcVar31 = pcVar22;
          }
          else if ((cVar4 != '%') || (iVar16 = 1, pcVar31 = format, format[1] == '%')) {
            format = format + (ulong)(cVar4 == '%') + 1;
            iVar16 = 0;
            pcVar31 = pcVar22;
          }
          pcVar22 = pcVar31;
        } while (iVar16 == 0);
        if (iVar16 == 1) {
          format = pcVar31;
        }
        if ((*format == '%') && (format[1] != '%')) {
          ImFormatString((char *)local_78,0x40,format,(double)fVar76);
          pcVar22 = (char *)((long)&local_80 + 7);
          do {
            pcVar31 = pcVar22 + 1;
            pcVar22 = pcVar22 + 1;
          } while (*pcVar31 == ' ');
          dVar73 = atof(pcVar22);
          fVar76 = (float)dVar73;
        }
        fVar75 = *v;
        if ((fVar75 != fVar76) || (NAN(fVar75) || NAN(fVar76))) {
          *(float *)v = fVar76;
          bVar42 = true;
        }
        else {
          bVar42 = (bool)(-(fVar76 != fVar75) & 1);
        }
      }
    }
    else {
      bVar42 = false;
    }
    fVar75 = 0.0;
    if ((fVar49 != fVar71) || (NAN(fVar49) || NAN(fVar71))) {
      fVar75 = *v;
      fVar48 = fVar71;
      fVar76 = fVar49;
      if (fVar71 <= fVar49) {
        fVar48 = fVar49;
        fVar76 = fVar71;
      }
      if (fVar75 <= fVar48) {
        fVar48 = fVar75;
      }
      fVar75 = (float)(~-(uint)(fVar75 < fVar76) & (uint)fVar48 |
                      (uint)fVar76 & -(uint)(fVar75 < fVar76));
      if ((power != 1.0) || (NAN(power))) {
        if (0.0 <= fVar75) {
          fVar49 = (float)(~-(uint)(fVar49 <= 0.0) & (uint)fVar49);
          fVar49 = powf((fVar75 - fVar49) / (fVar71 - fVar49),1.0 / power);
          fVar75 = (1.0 - fVar77) * fVar49 + fVar77;
        }
        else {
          fVar76 = 0.0;
          if (fVar71 <= 0.0) {
            fVar76 = fVar71;
          }
          fVar49 = powf(1.0 - (fVar75 - fVar49) / (fVar76 - fVar49),1.0 / power);
          fVar75 = fVar77 * (1.0 - fVar49);
        }
      }
      else {
        fVar75 = (fVar75 - fVar49) / (fVar71 - fVar49);
      }
    }
    fVar49 = -fVar74;
    if (uVar40 != 0) {
      fVar75 = 1.0 - fVar75;
    }
    fVar78 = (((fVar79 + -2.0) - fVar74 * 0.5) - fVar78) * fVar75 + fVar78;
    if (uVar40 != 0) {
      local_a8.x = (bb->Min).x;
      IStack_a0.x = (bb->Max).x;
      goto LAB_0018c3c7;
    }
    local_a8.x = fVar49 * 0.5 + fVar78;
    local_a8.y = (bb->Min).y;
    IStack_a0.y = (bb->Max).y;
    goto LAB_0018c39c;
  case 5:
    dVar73 = *v_min;
    if ((dVar73 < -8.988465674311579e+307) || (dVar3 = *v_max, 8.988465674311579e+307 < dVar3)) {
      __assert_fail("*(const double*)v_min >= -1.7976931348623157e+308/2.0f && *(const double*)v_max <= 1.7976931348623157e+308/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x235e,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar34 = GImGui->CurrentWindow;
    pIVar34->WriteAccessed = true;
    iVar16 = 9;
    if (pIVar14->ActiveId != id) {
      iVar16 = (pIVar14->HoveredId == id) + 7;
    }
    puVar1 = (undefined8 *)((long)&(pIVar14->Style).Colors[0].x + (ulong)(uint)(iVar16 << 4));
    local_78[0]._0_8_ = *puVar1;
    uVar10 = puVar1[1];
    local_78[0].w = (float)((ulong)uVar10 >> 0x20);
    local_78[0].z = (float)uVar10;
    local_78[0].w = (pIVar14->Style).Alpha * local_78[0].w;
    IVar17 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar17,true,(pIVar14->Style).FrameRounding);
    uVar40 = flags & 1;
    pIVar41 = (ImGuiContext *)(ulong)uVar40;
    pIVar19 = (ImRect *)&(bb->Min).y;
    pIVar20 = (ImVec2 *)&(bb->Max).y;
    if (uVar40 == 0) {
      pIVar19 = bb;
      pIVar20 = &bb->Max;
    }
    fVar49 = pIVar20->x;
    fVar79 = (fVar49 - (&(bb->Min).x)[(long)pIVar41]) + -4.0;
    fVar71 = (pIVar14->Style).GrabMinSize;
    if (fVar79 <= fVar71) {
      fVar71 = fVar79;
    }
    fVar74 = (pIVar19->Min).x;
    if (((power == 1.0) && (!NAN(power))) || (0.0 <= dVar73 * dVar3)) {
      if (dVar73 < 0.0) {
        fVar75 = 1.0;
      }
      else {
        fVar75 = 0.0;
      }
    }
    else {
      uVar47 = -(ulong)(-dVar73 <= dVar73);
      local_80 = 1.0 / (double)power;
      local_98._0_8_ = pow((double)(uVar47 & (ulong)dVar73 | ~uVar47 & (ulong)-dVar73),local_80);
      uVar47 = -(ulong)(-dVar3 <= dVar3);
      dVar50 = pow((double)(uVar47 & (ulong)dVar3 | ~uVar47 & (ulong)-dVar3),local_80);
      fVar75 = (float)((double)local_98._0_8_ / (dVar50 + (double)local_98._0_8_));
    }
    pIVar23 = GImGui;
    fVar74 = fVar74 + 2.0 + fVar71 * 0.5;
    if (pIVar14->ActiveId == id) {
      IVar5 = pIVar14->ActiveIdSource;
      if (IVar5 == ImGuiInputSource_Nav) {
        auVar60._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar41 = GImGui;
        auVar60._8_8_ = extraout_XMM0_Qb_00;
        if (uVar40 != 0) {
          fVar79 = auVar60._4_4_;
          auVar60._0_8_ = (ImVec2)(CONCAT44(fVar79,fVar79) ^ 0x8000000080000000);
          auVar60._8_4_ = -fVar79;
          auVar60._12_4_ = -fVar79;
        }
        fVar79 = auVar60._0_4_;
        if ((pIVar14->NavActivatePressedId == id) && (pIVar14->ActiveIdIsJustActivated == false)) {
          bVar42 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar42;
          if (bVar42) {
            pIVar41->ActiveIdTimer = 0.0;
          }
          pcVar22 = (char *)0x0;
          pIVar41->ActiveId = 0;
          pIVar41->ActiveIdAllowNavDirFlags = 0;
          pIVar41->ActiveIdAllowOverlap = false;
          pIVar41->ActiveIdWindow = (ImGuiWindow *)0x0;
          fVar78 = 0.0;
        }
        else {
          fVar78 = 0.0;
          if ((fVar79 != 0.0) || (NAN(fVar79))) {
            if ((dVar73 != dVar3) || (fVar78 = 0.0, NAN(dVar73) || NAN(dVar3))) {
              dVar50 = *v;
              dVar72 = dVar3;
              dVar13 = dVar73;
              if (dVar3 <= dVar73) {
                dVar72 = dVar73;
                dVar13 = dVar3;
              }
              if (dVar50 <= dVar72) {
                dVar72 = dVar50;
              }
              dVar50 = (double)(~-(ulong)(dVar50 < dVar13) & (ulong)dVar72 |
                               (ulong)dVar13 & -(ulong)(dVar50 < dVar13));
              if ((power != 1.0) || (NAN(power))) {
                local_98 = auVar60;
                if (0.0 <= dVar50) {
                  dVar72 = (double)(~-(ulong)(dVar73 <= 0.0) & (ulong)dVar73);
                  fVar79 = powf((float)((dVar50 - dVar72) / (dVar3 - dVar72)),1.0 / power);
                  fVar78 = (1.0 - fVar75) * fVar79 + fVar75;
                }
                else {
                  dVar72 = 0.0;
                  if (dVar3 <= 0.0) {
                    dVar72 = dVar3;
                  }
                  fVar79 = powf(1.0 - (float)((dVar50 - dVar73) / (dVar72 - dVar73)),1.0 / power);
                  fVar78 = (1.0 - fVar79) * fVar75;
                }
                fVar79 = (float)local_98._0_4_;
              }
              else {
                fVar78 = (float)((dVar50 - dVar73) / (dVar3 - dVar73));
              }
            }
            uVar46 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xe]);
            fVar79 = (float)(~uVar46 & (uint)(fVar79 / 100.0) |
                            (uint)((fVar79 / 100.0) / 10.0) & uVar46);
            uVar46 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar79 = (float)(uVar46 & (uint)(fVar79 * 10.0) | ~uVar46 & (uint)fVar79);
            if (((fVar78 < 1.0) || (fVar79 <= 0.0)) && ((0.0 < fVar78 || (0.0 <= fVar79)))) {
              fVar78 = fVar78 + fVar79;
              fVar77 = 1.0;
              if (fVar78 <= 1.0) {
                fVar77 = fVar78;
              }
              fVar77 = (float)(~-(uint)(fVar78 < 0.0) & (uint)fVar77);
              pIVar23 = GImGui;
              goto LAB_0018caa5;
            }
          }
          pcVar22 = (char *)0x0;
        }
      }
      else {
        fVar77 = 0.0;
        fVar78 = 0.0;
        if (IVar5 == ImGuiInputSource_Mouse) {
          if ((pIVar14->IO).MouseDown[0] == false) {
            bVar42 = GImGui->ActiveId != 0;
            GImGui->ActiveIdIsJustActivated = bVar42;
            if (bVar42) {
              pIVar23->ActiveIdTimer = 0.0;
            }
            pcVar22 = (char *)0x0;
            pIVar23->ActiveId = 0;
            pIVar23->ActiveIdAllowNavDirFlags = 0;
            pIVar23->ActiveIdAllowOverlap = false;
            pIVar23->ActiveIdWindow = (ImGuiWindow *)0x0;
          }
          else {
            pIVar23 = (ImGuiContext *)(ulong)IVar5;
            if (0.0 < fVar79 - fVar71) {
              fVar79 = (*(float *)((pIVar14->IO).MouseDown + (long)pIVar41 * 4 + -8) - fVar74) /
                       (fVar79 - fVar71);
              fVar77 = 1.0;
              if (fVar79 <= 1.0) {
                fVar77 = fVar79;
              }
              fVar77 = (float)(~-(uint)(fVar79 < 0.0) & (uint)fVar77);
              pIVar23 = pIVar41;
            }
            if (uVar40 != 0) {
              fVar77 = 1.0 - fVar77;
            }
LAB_0018caa5:
            pcVar22 = (char *)CONCAT71((int7)((ulong)pIVar23 >> 8),1);
            fVar78 = fVar77;
          }
        }
        else {
          pcVar22 = (char *)0x0;
        }
      }
      if ((char)pcVar22 == '\0') {
        bVar42 = false;
      }
      else {
        if ((power != 1.0) || (NAN(power))) {
          if (fVar75 <= fVar78) {
            uVar46 = -(uint)(1e-06 < ABS(fVar75 + -1.0));
            fVar79 = powf((float)(~uVar46 & (uint)fVar78 |
                                 (uint)((fVar78 - fVar75) / (1.0 - fVar75)) & uVar46),power);
            dVar50 = (double)(-(ulong)(0.0 <= dVar73) & (ulong)dVar73);
            dVar50 = (double)fVar79 * (dVar3 - dVar50) + dVar50;
            pcVar22 = extraout_RAX_02;
          }
          else {
            fVar79 = powf(1.0 - fVar78 / fVar75,power);
            dVar50 = dVar3;
            if (0.0 <= dVar3) {
              dVar50 = 0.0;
            }
            dVar50 = (double)fVar79 * (dVar73 - dVar50) + dVar50;
            pcVar22 = extraout_RAX_01;
          }
        }
        else {
          dVar50 = (double)fVar78 * (dVar3 - dVar73) + dVar73;
        }
        do {
          cVar4 = *format;
          if (cVar4 == '\0') {
            iVar16 = 3;
            pcVar31 = pcVar22;
          }
          else if ((cVar4 != '%') || (iVar16 = 1, pcVar31 = format, format[1] == '%')) {
            format = format + (ulong)(cVar4 == '%') + 1;
            iVar16 = 0;
            pcVar31 = pcVar22;
          }
          pcVar22 = pcVar31;
        } while (iVar16 == 0);
        if (iVar16 == 1) {
          format = pcVar31;
        }
        if ((*format == '%') && (format[1] != '%')) {
          ImFormatString((char *)local_78,0x40,format);
          pcVar22 = (char *)((long)&local_80 + 7);
          do {
            pcVar31 = pcVar22 + 1;
            pcVar22 = pcVar22 + 1;
          } while (*pcVar31 == ' ');
          dVar50 = atof(pcVar22);
        }
        dVar72 = *v;
        if ((dVar72 != dVar50) || (NAN(dVar72) || NAN(dVar50))) {
          *(double *)v = dVar50;
          bVar42 = true;
        }
        else {
          bVar42 = (bool)(-(dVar50 != dVar72) & 1);
        }
      }
    }
    else {
      bVar42 = false;
    }
    fVar79 = 0.0;
    if ((dVar73 != dVar3) || (NAN(dVar73) || NAN(dVar3))) {
      dVar50 = *v;
      dVar72 = dVar3;
      dVar13 = dVar73;
      if (dVar3 <= dVar73) {
        dVar72 = dVar73;
        dVar13 = dVar3;
      }
      if (dVar50 <= dVar72) {
        dVar72 = dVar50;
      }
      dVar50 = (double)(~-(ulong)(dVar50 < dVar13) & (ulong)dVar72 |
                       (ulong)dVar13 & -(ulong)(dVar50 < dVar13));
      if ((power != 1.0) || (NAN(power))) {
        if (0.0 <= dVar50) {
          dVar73 = (double)(~-(ulong)(dVar73 <= 0.0) & (ulong)dVar73);
          fVar79 = powf((float)((dVar50 - dVar73) / (dVar3 - dVar73)),1.0 / power);
          fVar79 = (1.0 - fVar75) * fVar79 + fVar75;
        }
        else {
          dVar72 = 0.0;
          if (dVar3 <= 0.0) {
            dVar72 = dVar3;
          }
          fVar79 = powf(1.0 - (float)((dVar50 - dVar73) / (dVar72 - dVar73)),1.0 / power);
          fVar79 = fVar75 * (1.0 - fVar79);
        }
      }
      else {
        fVar79 = (float)((dVar50 - dVar73) / (dVar3 - dVar73));
      }
    }
    if (uVar40 != 0) {
      fVar79 = 1.0 - fVar79;
    }
    fVar74 = (((fVar49 + -2.0) - fVar71 * 0.5) - fVar74) * fVar79 + fVar74;
    if (uVar40 != 0) {
      local_a8.x = (bb->Min).x + 2.0;
      local_a8.y = -fVar71 * 0.5 + fVar74;
      IStack_a0.x = (bb->Max).x + -2.0;
      IStack_a0.y = fVar71 * 0.5 + fVar74;
    }
    else {
      local_a8.x = -fVar71 * 0.5 + fVar74;
      local_a8.y = (bb->Min).y + 2.0;
      IStack_a0.x = fVar71 * 0.5 + fVar74;
      IStack_a0.y = (bb->Max).y + -2.0;
    }
    this = pIVar34->DrawList;
    goto LAB_0018c419;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2362,
                  "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                 );
  }
  fVar49 = -fVar74;
  bVar43 = (flags & 1U) != 0;
  if (bVar43) {
    fVar75 = 1.0 - fVar75;
  }
  fVar78 = ((fVar79 - fVar71) - fVar78) * fVar75 + fVar78;
  if (bVar43) {
    local_a8.x = (bb->Min).x;
    IStack_a0.x = (bb->Max).x;
LAB_0018c3c7:
    local_a8.x = local_a8.x + 2.0;
    local_a8.y = fVar49 * 0.5 + fVar78;
    IStack_a0.x = IStack_a0.x + -2.0;
    IStack_a0.y = fVar74 * 0.5 + fVar78;
  }
  else {
    local_a8.x = fVar49 * 0.5 + fVar78;
    local_a8.y = (bb->Min).y;
    IStack_a0.y = (bb->Max).y;
LAB_0018c39c:
    local_a8.y = local_a8.y + 2.0;
    IStack_a0.x = fVar74 * 0.5 + fVar78;
    IStack_a0.y = IStack_a0.y + -2.0;
  }
  this = pIVar34->DrawList;
LAB_0018c419:
  pIVar2 = (GImGui->Style).Colors + (ulong)(pIVar14->ActiveId == id) + 0x13;
  local_78[0].x = pIVar2->x;
  local_78[0].y = pIVar2->y;
  uVar11 = pIVar2->z;
  uVar12 = pIVar2->w;
  local_78[0].w = (GImGui->Style).Alpha * (float)uVar12;
  local_78[0].z = (float)uVar11;
  IVar17 = ColorConvertFloat4ToU32(local_78);
  ImDrawList::AddRectFilled(this,&local_a8,&IStack_a0,IVar17,(pIVar14->Style).GrabRounding,0xf);
  return bVar42;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* v, const void* v_min, const void* v_max, const char* format, float power, ImGuiSliderFlags flags)
{
    switch (data_type)
    {
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)v,  *(const ImS32*)v_min,  *(const ImS32*)v_max,  format, power, flags);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)v_min <= IM_U32_MAX/2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)v,  *(const ImU32*)v_min,  *(const ImU32*)v_max,  format, power, flags);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)v,  *(const ImS64*)v_min,  *(const ImS64*)v_max,  format, power, flags);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)v_min <= IM_U64_MAX/2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)v,  *(const ImU64*)v_min,  *(const ImU64*)v_max,  format, power, flags);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)v_min >= -FLT_MAX/2.0f && *(const float*)v_max <= FLT_MAX/2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)v,  *(const float*)v_min,  *(const float*)v_max,  format, power, flags);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)v_min >= -DBL_MAX/2.0f && *(const double*)v_max <= DBL_MAX/2.0f);
        return SliderBehaviorT<double,double,double>(bb, id, data_type, (double*)v, *(const double*)v_min, *(const double*)v_max, format, power, flags);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}